

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void helper_gvec_fcaddd_aarch64(void *vd,void *vn,void *vm,void *vfpst,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  float64 fVar3;
  float64 fVar4;
  ulong uVar5;
  uintptr_t i;
  ulong uVar6;
  
  uVar1 = (desc & 0x1f) * 8 + 8;
  uVar6 = (ulong)uVar1;
  for (uVar5 = 0; uVar5 < uVar1 >> 3; uVar5 = uVar5 + 2) {
    fVar4 = *(float64 *)((long)vn + uVar5 * 8 + 8);
    uVar2 = *(ulong *)((long)vm + uVar5 * 8);
    fVar3 = float64_add_aarch64(*(float64 *)((long)vn + uVar5 * 8),
                                *(ulong *)((long)vm + uVar5 * 8 + 8) ^ (ulong)~(desc >> 10) << 0x3f,
                                (float_status *)vfpst);
    *(float64 *)((long)vd + uVar5 * 8) = fVar3;
    fVar4 = float64_add_aarch64(fVar4,uVar2 ^ (ulong)(desc >> 10) << 0x3f,(float_status *)vfpst);
    *(float64 *)((long)vd + uVar5 * 8 + 8) = fVar4;
  }
  for (; uVar6 < (desc >> 2 & 0xf8) + 8; uVar6 = uVar6 + 8) {
    *(undefined8 *)((long)vd + uVar6) = 0;
  }
  return;
}

Assistant:

void HELPER(gvec_fcaddd)(void *vd, void *vn, void *vm,
                         void *vfpst, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    float64 *d = vd;
    float64 *n = vn;
    float64 *m = vm;
    float_status *fpst = vfpst;
    uint64_t neg_real = extract64(desc, SIMD_DATA_SHIFT, 1);
    uint64_t neg_imag = neg_real ^ 1;
    uintptr_t i;

    /* Shift boolean to the sign bit so we can xor to negate.  */
    neg_real <<= 63;
    neg_imag <<= 63;

    for (i = 0; i < opr_sz / 8; i += 2) {
        float64 e0 = n[i];
        float64 e1 = m[i + 1] ^ neg_imag;
        float64 e2 = n[i + 1];
        float64 e3 = m[i] ^ neg_real;

        d[i] = float64_add(e0, e1, fpst);
        d[i + 1] = float64_add(e2, e3, fpst);
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}